

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::PrepareForDraw
          (DeviceContextGLImpl *this,DRAW_FLAGS Flags,bool IsIndexed,GLenum *GlTopology)

{
  GLContextState *ContextState;
  Uint32 *Args_2;
  PRIMITIVE_TOPOLOGY PrimTopology;
  PipelineStateGLImpl *this_00;
  BufferGLImpl *pBVar1;
  byte bVar2;
  Uint32 DrawBuffersMask;
  GLenum GVar3;
  FBOCache *this_01;
  GLFrameBufferObj *pGVar4;
  GraphicsPipelineDesc *pGVar5;
  VAOCache *this_02;
  GLVertexArrayObj *VAO;
  char (*in_stack_ffffffffffffffa8) [2];
  string msg;
  
  ContextState = &this->m_ContextState;
  if ((((this->m_ContextState).m_FBOId < 0) &&
      ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets == 0))
     && ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pBoundDepthStencil.
         m_pObject == (TextureViewGLImpl *)0x0)) {
    if (((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_FramebufferWidth == 0) ||
       ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_FramebufferHeight == 0)) {
      FormatString<char[131]>
                (&msg,(char (*) [131])
                      "Framebuffer width and height must be positive when rendering without attachments. Call SetViewports() to set the framebuffer size."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"PrepareForDraw",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x2f5);
      std::__cxx11::string::~string((string *)&msg);
    }
    this_01 = RenderDeviceGLImpl::GetFBOCache
                        ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pDevice.
                         m_pObject,(this->m_ContextState).m_CurrentGLContext);
    pGVar4 = FBOCache::GetFBO(this_01,(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                                      m_FramebufferWidth,
                              (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                              m_FramebufferHeight,ContextState);
    GLContextState::BindFBO(ContextState,pGVar4);
    this->m_DrawFBO = (GLFrameBufferObj *)0x0;
  }
  if (this->m_DrawBuffersCommitted == false) {
    if (((this->m_IsDefaultFBOBound == false) &&
        ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumBoundRenderTargets != 0)
        ) && ((this->m_DrawFBO != (GLFrameBufferObj *)0x0 &&
              (this_00 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                         m_pPipelineState.m_pObject, this_00 != (PipelineStateGLImpl *)0x0)))) {
      Args_2 = &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                m_NumBoundRenderTargets;
      pGVar5 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                         (&this_00->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      if (*Args_2 != (uint)pGVar5->NumRenderTargets) {
        pGVar5 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                           (&((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                              m_pPipelineState.m_pObject)->
                             super_PipelineStateBase<Diligent::EngineGLImplTraits>);
        FormatString<char[53],unsigned_char,char[54],unsigned_int,char[2]>
                  (&msg,(Diligent *)"The number of render targets in the pipeline state (",
                   (char (*) [53])&pGVar5->NumRenderTargets,
                   (uchar *)") does not match the number of bound render targets (",
                   (char (*) [54])Args_2,(uint *)0x801c00,in_stack_ffffffffffffffa8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"PrepareForDraw",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x305);
        std::__cxx11::string::~string((string *)&msg);
      }
      pGVar4 = this->m_DrawFBO;
      DrawBuffersMask =
           PipelineStateBase<Diligent::EngineGLImplTraits>::GetRenderTargetMask
                     (&((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                        m_pPipelineState.m_pObject)->
                       super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      GLObjectWrappers::GLFrameBufferObj::SetDrawBuffers(pGVar4,0xffffffff,DrawBuffersMask);
    }
    this->m_DrawBuffersCommitted = true;
  }
  DeviceContextBase<Diligent::EngineGLImplTraits>::DvpVerifyRenderTargets
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>);
  PipelineStateGLImpl::CommitProgram
            ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
             m_pObject,ContextState);
  bVar2 = DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::GetCommitMask
                    (&(this->m_BindInfo).super_CommittedShaderResources,
                     (bool)((Flags & DRAW_FLAG_DYNAMIC_RESOURCE_BUFFERS_INTACT) >> 2));
  if (bVar2 != 0) {
    BindProgramResources(this,(uint)bVar2);
  }
  DvpValidateCommittedShaderResources(this);
  pGVar5 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                     (&((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                        m_pPipelineState.m_pObject)->
                       super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  if ((this->m_ContextState).m_VAOId < 1) {
    this_02 = RenderDeviceGLImpl::GetVAOCache
                        ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pDevice.
                         m_pObject,(this->m_ContextState).m_CurrentGLContext);
    pBVar1 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pIndexBuffer.m_pObject;
    if ((pGVar5->InputLayout).NumElements == 0 && pBVar1 == (BufferGLImpl *)0x0) {
      VAO = VAOCache::GetEmptyVAO(this_02);
    }
    else {
      msg._M_dataplus._M_p =
           (pointer)(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
                    m_pObject;
      msg.field_2._M_allocated_capacity =
           (size_type)(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_VertexStreams;
      msg.field_2._8_4_ =
           (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_NumVertexStreams;
      msg._M_string_length = (size_type)pBVar1;
      VAO = VAOCache::GetVAO(this_02,(VAOAttribs *)&msg,ContextState);
    }
    GLContextState::BindVAO(ContextState,VAO);
  }
  PrimTopology = pGVar5->PrimitiveTopology;
  if (PrimTopology < PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST) {
    GVar3 = PrimitiveTopologyToGLTopology(PrimTopology);
    *GlTopology = GVar3;
  }
  else {
    *GlTopology = 0xe;
    GLContextState::SetNumPatchVertices(ContextState,PrimTopology - 9);
  }
  return;
}

Assistant:

void DeviceContextGLImpl::PrepareForDraw(DRAW_FLAGS Flags, bool IsIndexed, GLenum& GlTopology)
{
    if (!m_ContextState.IsValidFBOBound() && m_NumBoundRenderTargets == 0 && !m_pBoundDepthStencil)
    {
        // Framebuffer without attachments
        DEV_CHECK_ERR(m_FramebufferWidth > 0 && m_FramebufferHeight > 0,
                      "Framebuffer width and height must be positive when rendering without attachments. Call SetViewports() to set the framebuffer size.");
        FBOCache& FboCache = m_pDevice->GetFBOCache(m_ContextState.GetCurrentGLContext());

        const GLObjectWrappers::GLFrameBufferObj& FBO = FboCache.GetFBO(m_FramebufferWidth, m_FramebufferHeight, m_ContextState);
        m_ContextState.BindFBO(FBO);
        m_DrawFBO = nullptr;
    }

    if (!m_DrawBuffersCommitted)
    {
        if (!m_IsDefaultFBOBound && m_NumBoundRenderTargets > 0 && m_DrawFBO != nullptr)
        {
            if (m_pPipelineState)
            {
                VERIFY(m_pPipelineState->GetGraphicsPipelineDesc().NumRenderTargets == m_NumBoundRenderTargets,
                       "The number of render targets in the pipeline state (", m_pPipelineState->GetGraphicsPipelineDesc().NumRenderTargets,
                       ") does not match the number of bound render targets (", m_NumBoundRenderTargets, ")");
                m_DrawFBO->SetDrawBuffers(~0u, m_pPipelineState->GetRenderTargetMask());
            }
        }
        m_DrawBuffersCommitted = true;
    }

#ifdef DILIGENT_DEVELOPMENT
    DvpVerifyRenderTargets();
#endif

    // The program might have changed since the last SetPipelineState call if a shader was
    // created after the call (ShaderResourcesGL needs to bind a program to load uniforms).
    m_pPipelineState->CommitProgram(m_ContextState);
    if (Uint32 BindSRBMask = m_BindInfo.GetCommitMask(Flags & DRAW_FLAG_DYNAMIC_RESOURCE_BUFFERS_INTACT))
    {
        BindProgramResources(BindSRBMask);
    }

#ifdef DILIGENT_DEVELOPMENT
    // Must be called after BindProgramResources as it needs BaseBindings
    DvpValidateCommittedShaderResources();
#endif

    const GraphicsPipelineDesc& PipelineDesc = m_pPipelineState->GetGraphicsPipelineDesc();
    if (!m_ContextState.IsValidVAOBound())
    {
        VAOCache& VaoCache = m_pDevice->GetVAOCache(m_ContextState.GetCurrentGLContext());
        if (PipelineDesc.InputLayout.NumElements > 0 || m_pIndexBuffer != nullptr)
        {
            VAOCache::VAOAttribs vaoAttribs //
                {
                    *m_pPipelineState,
                    m_pIndexBuffer,
                    m_VertexStreams,
                    m_NumVertexStreams //
                };
            const GLObjectWrappers::GLVertexArrayObj& VAO = VaoCache.GetVAO(vaoAttribs, m_ContextState);
            m_ContextState.BindVAO(VAO);
        }
        else
        {
            // Draw command will fail if no VAO is bound. If no vertex description is set
            // (which is the case if, for instance, the command only inputs VertexID),
            // use empty VAO
            const GLObjectWrappers::GLVertexArrayObj& VAO = VaoCache.GetEmptyVAO();
            m_ContextState.BindVAO(VAO);
        }
    }

    PRIMITIVE_TOPOLOGY Topology = PipelineDesc.PrimitiveTopology;
    if (Topology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST)
    {
#if GL_ARB_tessellation_shader
        GlTopology        = GL_PATCHES;
        Int32 NumVertices = static_cast<Int32>(Topology - PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST + 1);
        m_ContextState.SetNumPatchVertices(NumVertices);
#else
        UNSUPPORTED("Tessellation is not supported");
#endif
    }
    else
    {
        GlTopology = PrimitiveTopologyToGLTopology(Topology);
    }
}